

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *self;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      self = (AActor *)(param->field_0).field_1.a;
      if (self != (AActor *)0x0) {
        if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (self->super_DThinker).super_DObject.Class;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e139b;
        }
      }
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          pPVar2 = (PClass *)param[1].field_0.field_1.a;
          if ((pPVar2 != (PClass *)0x0) &&
             (pPVar4 = pPVar2, pPVar2 != AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar4 = pPVar4->ParentClass;
              if (pPVar4 == AActor::RegistrationInfo.MyClass) break;
            } while (pPVar4 != (PClass *)0x0);
            if (pPVar4 == (PClass *)0x0) {
              pcVar7 = "classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_003e1455;
            }
          }
          if (numparam < 3) {
            pcVar7 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              pVVar1 = param + 2;
              if (numparam == 3) {
                pVVar5 = defaultparam->Array;
                if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
                  pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e13f8:
                  __assert_fail(pcVar7,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x1974,
                                "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              else {
                pVVar5 = param;
                if (param[3].field_0.field_3.Type != '\0') {
                  pcVar7 = "(param[paramnum]).Type == REGT_INT";
                  goto LAB_003e13f8;
                }
              }
              if (numparam < 5) {
                pVVar6 = defaultparam->Array;
                if (pVVar6[4].field_0.field_3.Type != '\0') {
                  pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003e1417;
                }
              }
              else {
                pVVar6 = param;
                if (param[4].field_0.field_3.Type != '\0') {
                  pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003e1417:
                  __assert_fail(pcVar7,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x1975,
                                "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              if (numparam < 6) {
                param = defaultparam->Array;
                if (param[5].field_0.field_3.Type == '\0') goto LAB_003e12f3;
                pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
              }
              else {
                if (param[5].field_0.field_3.Type == '\0') {
LAB_003e12f3:
                  iVar8 = 0;
                  iVar3 = P_Thing_CheckProximity
                                    (self,pPVar2,(pVVar1->field_0).f,pVVar5[3].field_0.i,
                                     pVVar6[4].field_0.i,param[5].field_0.i,false);
                  if (0 < numret) {
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x1978,
                                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    if (ret->RegType != '\0') {
                      __assert_fail("RegType == REGT_INT",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                    ,0x13f,"void VMReturn::SetInt(int)");
                    }
                    *(uint *)ret->Location = (uint)(iVar3 != 0);
                    iVar8 = 1;
                  }
                  return iVar8;
                }
                pcVar7 = "(param[paramnum]).Type == REGT_INT";
              }
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1976,
                            "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar7 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1973,
                        "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003e1455:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1972,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e139b:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1971,
                "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckProximity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(classname, AActor);
	PARAM_FLOAT(distance);
	PARAM_INT_DEF(count);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	ACTION_RETURN_BOOL(!!P_Thing_CheckProximity(self, classname, distance, count, flags, ptr));
}